

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::InitialLength>::mapping
               (IO *IO,InitialLength *InitialLength)

{
  yaml::IO::mapRequired<unsigned_int>(IO,"TotalLength",&InitialLength->TotalLength);
  if (InitialLength->TotalLength != 0xffffffff) {
    return;
  }
  yaml::IO::mapRequired<unsigned_long>(IO,"TotalLength64",&InitialLength->TotalLength64);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::InitialLength>::mapping(
    IO &IO, DWARFYAML::InitialLength &InitialLength) {
  IO.mapRequired("TotalLength", InitialLength.TotalLength);
  if (InitialLength.isDWARF64())
    IO.mapRequired("TotalLength64", InitialLength.TotalLength64);
}